

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureTest::iterate(TextureTest *this)

{
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ResultCollector result;
  allocator<char> local_99;
  CallLogWrapper local_98;
  string local_80;
  ResultCollector local_60;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_98,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector(&local_60,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  local_98.m_enableLog = true;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_98,&local_60);
  tcu::ResultCollector::setTestContextResult
            (&local_60,(this->super_TestCase).super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&local_60);
  glu::CallLogWrapper::~CallLogWrapper(&local_98);
  return STOP;
}

Assistant:

TextureTest::IterateResult TextureTest::iterate (void)
{
	glu::CallLogWrapper		gl		(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	test(gl, result);

	result.setTestContextResult(m_testCtx);
	return STOP;
}